

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::NamespaceScope::NamespaceScope
          (NamespaceScope *this,NamespaceScope *initialize,MemoryManager *manager)

{
  StackElem *pSVar1;
  XMLCh *prefixToAdd;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  IllegalArgumentException *this_00;
  ulong uVar4;
  ulong uVar5;
  
  (this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver =
       (_func_int **)&PTR_getNamespaceForPrefix_0040ee78;
  this->fEmptyNamespaceId = 0;
  this->fStackCapacity = 8;
  this->fStackTop = 0;
  XMLStringPool::XMLStringPool(&this->fPrefixPool,0x6d,manager);
  this->fStack = (StackElem **)0x0;
  this->fMemoryManager = manager;
  iVar2 = (*manager->_vptr_MemoryManager[3])(manager);
  this->fStack = (StackElem **)CONCAT44(extraout_var,iVar2);
  memset((StackElem **)CONCAT44(extraout_var,iVar2),0,(ulong)this->fStackCapacity << 3);
  if (initialize != (NamespaceScope *)0x0) {
    uVar3 = initialize->fEmptyNamespaceId;
    XMLStringPool::flushAll(&this->fPrefixPool);
    this->fStackTop = 0;
    this->fEmptyNamespaceId = uVar3;
    increaseDepth(this);
    for (uVar5 = (ulong)initialize->fStackTop; uVar5 != 0; uVar5 = uVar5 - 1) {
      pSVar1 = initialize->fStack[uVar5 - 1];
      if (pSVar1->fMapCount != 0) {
        uVar4 = 0;
        do {
          uVar3 = pSVar1->fMap[uVar4].fPrefId;
          if (((ulong)uVar3 == 0) || ((initialize->fPrefixPool).fCurId <= uVar3)) {
            this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
            IllegalArgumentException::IllegalArgumentException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/StringPool.hpp"
                       ,0xa2,StrPool_IllegalId,(initialize->fPrefixPool).fMemoryManager);
            __cxa_throw(this_00,&IllegalArgumentException::typeinfo,XMLException::~XMLException);
          }
          prefixToAdd = (initialize->fPrefixPool).fIdMap[uVar3]->fString;
          uVar3 = (**(this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver)
                            (this,prefixToAdd);
          if (uVar3 == this->fEmptyNamespaceId) {
            addPrefix(this,prefixToAdd,pSVar1->fMap[uVar4].fURIId);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < pSVar1->fMapCount);
      }
    }
  }
  return;
}

Assistant:

NamespaceScope::NamespaceScope(const NamespaceScope* const initialize, MemoryManager* const manager /*= XMLPlatformUtils::fgMemoryManager*/) :
    fEmptyNamespaceId(0)
    , fStackCapacity(8)
    , fStackTop(0)
    , fPrefixPool(109, manager)
    , fStack(0)
    , fMemoryManager(manager)
{
    // Do an initial allocation of the stack and zero it out
    fStack = (StackElem**) fMemoryManager->allocate
    (
        fStackCapacity * sizeof(StackElem*)
    );//new StackElem*[fStackCapacity];
    memset(fStack, 0, fStackCapacity * sizeof(StackElem*));

    if(initialize)
    {
        reset(initialize->fEmptyNamespaceId);

        // copy the existing bindings
        for (unsigned int index = initialize->fStackTop; index > 0; index--)
        {
            // Get a convenience pointer to the current element
            StackElem* curRow = initialize->fStack[index-1];

            // If no prefixes mapped at this level, then go the next one
            if (!curRow->fMapCount)
                continue;

            for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
            {
                // go from the id to the prefix
                const XMLCh* prefix = initialize->fPrefixPool.getValueForId(curRow->fMap[mapIndex].fPrefId);

                // if the prefix is not already known, add it
                if(getNamespaceForPrefix(prefix)==fEmptyNamespaceId)
                    addPrefix(prefix, curRow->fMap[mapIndex].fURIId);
            }
        }
    }
}